

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int input_insn_var_iterator_next
              (gen_ctx_t gen_ctx,insn_var_iterator_t *iter,MIR_reg_t *var,int *op_num)

{
  char cVar1;
  MIR_reg_t MVar2;
  size_t sVar3;
  undefined8 in_RAX;
  ulong uVar4;
  MIR_insn_t insn;
  bool bVar5;
  int out_p;
  undefined8 uStack_38;
  
  uVar4 = iter->op_num;
  if (uVar4 < iter->nops) {
    insn = iter->insn;
    uStack_38 = in_RAX;
    do {
      *op_num = (int)uVar4;
      MIR_insn_op_mode(gen_ctx->ctx,insn,uVar4,(int *)((long)&uStack_38 + 4));
      sVar3 = iter->op_num;
      insn = iter->insn;
      if ((uStack_38._4_4_ == 0) || (insn->ops[sVar3].field_0x8 == '\v')) {
        uVar4 = iter->op_part_num;
        if (uVar4 < 2) {
          do {
            cVar1 = insn->ops[sVar3].field_0x8;
            if (cVar1 != '\v') {
              if ((uVar4 != 1) && (cVar1 == '\x02')) {
                *var = insn->ops[sVar3].u.reg;
LAB_00160386:
                iter->op_part_num = uVar4 + 1;
                return 1;
              }
              break;
            }
            MVar2 = *(MIR_reg_t *)((long)&insn->ops[sVar3].u + (ulong)(uVar4 != 0) * 4 + 0x10);
            *var = MVar2;
            if (MVar2 != 0xffffffff) goto LAB_00160386;
            iter->op_part_num = uVar4 + 1;
            bVar5 = uVar4 == 0;
            uVar4 = 1;
          } while (bVar5);
        }
        iter->op_num = sVar3 + 1;
        iter->op_part_num = 0;
      }
      else {
        iter->op_num = sVar3 + 1;
      }
      uVar4 = sVar3 + 1;
    } while (uVar4 < iter->nops);
  }
  return 0;
}

Assistant:

static inline int input_insn_var_iterator_next (gen_ctx_t gen_ctx, insn_var_iterator_t *iter,
                                                MIR_reg_t *var, int *op_num) {
  MIR_op_t *op_ref;
  int out_p;

  while (iter->op_num < iter->nops) {
    *op_num = (int) iter->op_num;
    MIR_insn_op_mode (gen_ctx->ctx, iter->insn, iter->op_num, &out_p);
    op_ref = &iter->insn->ops[iter->op_num];
    if (out_p && op_ref->mode != MIR_OP_VAR_MEM) {
      iter->op_num++;
      continue;
    }
    while (iter->op_part_num < 2) {
      if (op_ref->mode == MIR_OP_VAR_MEM) {
        *var = iter->op_part_num == 0 ? op_ref->u.var_mem.base : op_ref->u.var_mem.index;
        if (*var == MIR_NON_VAR) {
          iter->op_part_num++;
          continue;
        }
      } else if (iter->op_part_num > 0) {
        break;
      } else if (op_ref->mode == MIR_OP_VAR) {
        *var = op_ref->u.var;
      } else
        break;
      iter->op_part_num++;
      return TRUE;
    }
    iter->op_num++;
    iter->op_part_num = 0;
  }
  return FALSE;
}